

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode
writeValueRankAttribute
          (UA_Server *server,UA_VariableNode *node,UA_Int32 valueRank,UA_Int32 constraintValueRank)

{
  UA_Boolean UVar1;
  UA_StatusCode UVar2;
  undefined1 local_98 [8];
  UA_DataValue value;
  size_t sStack_30;
  UA_StatusCode retval;
  size_t arrayDims;
  UA_Int32 constraintValueRank_local;
  UA_Int32 valueRank_local;
  UA_VariableNode *node_local;
  UA_Server *server_local;
  
  if ((node->nodeClass == UA_NODECLASS_VARIABLETYPE) &&
     (UVar1 = UA_Node_hasSubTypeOrInstances((UA_Node *)node), UVar1)) {
    return 0x80020000;
  }
  switch(constraintValueRank) {
  case 0:
    if (valueRank < 0) {
      return 0x80740000;
    }
    break;
  case -3:
    if ((valueRank != -1) && (valueRank != 1)) {
      return 0x80740000;
    }
    break;
  case -2:
    break;
  case -1:
    if (valueRank != -1) {
      return 0x80740000;
    }
    break;
  default:
    if (valueRank != constraintValueRank) {
      return 0x80740000;
    }
  }
  sStack_30 = node->arrayDimensionsSize;
  value._92_4_ = 0;
  if (sStack_30 == 0) {
    UA_DataValue_init((UA_DataValue *)local_98);
    value._92_4_ = readValueAttribute(server,node,(UA_DataValue *)local_98);
    if (value._92_4_ != 0) {
      return value._92_4_;
    }
    if (((local_98[0] & 1) == 0) || (value.value.arrayLength == 0)) goto LAB_0012b31d;
    UVar1 = UA_Variant_isScalar((UA_Variant *)&value);
    if (!UVar1) {
      sStack_30 = 1;
    }
    UA_DataValue_deleteMembers((UA_DataValue *)local_98);
  }
  UVar2 = compatibleValueRankArrayDimensions(valueRank,sStack_30);
  if (UVar2 != 0) {
    return UVar2;
  }
LAB_0012b31d:
  node->valueRank = valueRank;
  return 0;
}

Assistant:

UA_StatusCode
writeValueRankAttribute(UA_Server *server, UA_VariableNode *node, UA_Int32 valueRank,
                        UA_Int32 constraintValueRank) {
    /* If this is a variabletype, there must be no instances or subtypes of it
       when we do the change */
    if(node->nodeClass == UA_NODECLASS_VARIABLETYPE &&
       UA_Node_hasSubTypeOrInstances((const UA_Node*)node))
        return UA_STATUSCODE_BADINTERNALERROR;

    /* Check if the valuerank of the variabletype allows the change. */
    switch(constraintValueRank) {
    case -3: /* the value can be a scalar or a one dimensional array */
        if(valueRank != -1 && valueRank != 1)
            return UA_STATUSCODE_BADTYPEMISMATCH;
        break;
    case -2: /* the value can be a scalar or an array with any number of dimensions */
        break;
    case -1: /* the value is a scalar */
        if(valueRank != -1)
            return UA_STATUSCODE_BADTYPEMISMATCH;
        break;
    case 0: /* the value is an array with one or more dimensions */
        if(valueRank < 0)
            return UA_STATUSCODE_BADTYPEMISMATCH;
        break;
    default: /* >= 1: the value is an array with the specified number of dimensions */
        if(valueRank != constraintValueRank)
            return UA_STATUSCODE_BADTYPEMISMATCH;
        break;
    }

    /* Check if the new valuerank is compatible with the array dimensions. Use
     * the read service to handle data sources. */
    size_t arrayDims = node->arrayDimensionsSize;
    UA_StatusCode retval = UA_STATUSCODE_GOOD;
    if(arrayDims == 0) {
        /* the value could be an array with no arrayDimensions defined.
           dimensions zero indicate a scalar for compatibleValueRankArrayDimensions. */
        UA_DataValue value;
        UA_DataValue_init(&value);
        retval = readValueAttribute(server, node, &value);
        if(retval != UA_STATUSCODE_GOOD)
            return retval;
        if(!value.hasValue || value.value.data == NULL)
            goto apply; /* no value or null array */
        if(!UA_Variant_isScalar(&value.value))
            arrayDims = 1;
        UA_DataValue_deleteMembers(&value);
    }
    retval = compatibleValueRankArrayDimensions(valueRank, arrayDims);
    if(retval != UA_STATUSCODE_GOOD)
        return retval;

    /* All good, apply the change */
 apply:
    node->valueRank = valueRank;
    return UA_STATUSCODE_GOOD;
}